

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::PopPolicyBarrier(cmMakefile *this,bool reportError)

{
  pointer *ppuVar1;
  ulong uVar2;
  allocator local_51;
  string local_50;
  
  uVar2 = (this->PolicyBarriers).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1];
  while (uVar2 < (ulong)(((long)(this->PolicyStack).
                                super__Vector_base<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->PolicyStack).
                               super__Vector_base<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x30)) {
    if ((reportError & 1U) != 0) {
      std::__cxx11::string::string
                ((string *)&local_50,"cmake_policy PUSH without matching POP",&local_51);
      IssueMessage(this,FATAL_ERROR,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    PopPolicy(this);
    reportError = false;
  }
  ppuVar1 = &(this->PolicyBarriers).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + -1;
  return;
}

Assistant:

void cmMakefile::PopPolicyBarrier(bool reportError)
{
  // Remove any extra entries pushed on the barrier.
  PolicyStackType::size_type barrier = this->PolicyBarriers.back();
  while(this->PolicyStack.size() > barrier)
    {
    if(reportError)
      {
      this->IssueMessage(cmake::FATAL_ERROR,
                         "cmake_policy PUSH without matching POP");
      reportError = false;
      }
    this->PopPolicy();
    }

  // Remove the barrier.
  this->PolicyBarriers.pop_back();
}